

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O2

FT_Error raccess_guess_apple_generic
                   (FT_Library library,FT_Stream stream,char *base_file_name,FT_Int32 magic,
                   FT_Long *result_offset)

{
  FT_UShort FVar1;
  FT_Error FVar2;
  undefined8 in_RAX;
  FT_ULong FVar3;
  uint uVar4;
  bool bVar5;
  undefined8 uStack_38;
  FT_Error error;
  
  uStack_38 = in_RAX;
  FVar3 = FT_Stream_ReadULong((FT_Stream)library,(FT_Error *)((long)&uStack_38 + 4));
  if (uStack_38._4_4_ != 0) {
    return uStack_38._4_4_;
  }
  if ((int)FVar3 == (int)stream) {
    FT_Stream_ReadULong((FT_Stream)library,(FT_Error *)((long)&uStack_38 + 4));
    if (uStack_38._4_4_ != 0) {
      return uStack_38._4_4_;
    }
    FVar2 = FT_Stream_Skip((FT_Stream)library,0x10);
    if (FVar2 != 0) {
      return FVar2;
    }
    uStack_38._4_4_ = FVar2;
    FVar1 = FT_Stream_ReadUShort((FT_Stream)library,(FT_Error *)((long)&uStack_38 + 4));
    if (uStack_38._4_4_ != 0) {
      return uStack_38._4_4_;
    }
    if (FVar1 != 0) {
      uVar4 = (uint)FVar1;
      while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
        FVar3 = FT_Stream_ReadULong((FT_Stream)library,(FT_Error *)((long)&uStack_38 + 4));
        if (uStack_38._4_4_ != 0) {
          return uStack_38._4_4_;
        }
        if (FVar3 == 2) {
          FVar3 = FT_Stream_ReadULong((FT_Stream)library,(FT_Error *)((long)&uStack_38 + 4));
          if ((uStack_38._4_4_ == 0) &&
             (FT_Stream_ReadULong((FT_Stream)library,(FT_Error *)((long)&uStack_38 + 4)),
             uStack_38._4_4_ == 0)) {
            *(long *)base_file_name = (long)(int)FVar3;
            return 0;
          }
        }
        else {
          uStack_38._4_4_ = FT_Stream_Skip((FT_Stream)library,8);
          if (uStack_38._4_4_ != 0) {
            return uStack_38._4_4_;
          }
        }
      }
    }
  }
  return 2;
}

Assistant:

static FT_Error
  raccess_guess_apple_generic( FT_Library  library,
                               FT_Stream   stream,
                               char       *base_file_name,
                               FT_Int32    magic,
                               FT_Long    *result_offset )
  {
    FT_Int32   magic_from_stream;
    FT_Error   error;
    FT_Int32   version_number = 0;
    FT_UShort  n_of_entries;

    int        i;
    FT_Int32   entry_id, entry_offset, entry_length = 0;

    const FT_Int32  resource_fork_entry_id = 0x2;

    FT_UNUSED( library );
    FT_UNUSED( base_file_name );
    FT_UNUSED( version_number );
    FT_UNUSED( entry_length   );


    if ( FT_READ_LONG( magic_from_stream ) )
      return error;
    if ( magic_from_stream != magic )
      return FT_THROW( Unknown_File_Format );

    if ( FT_READ_LONG( version_number ) )
      return error;

    /* filler */
    error = FT_Stream_Skip( stream, 16 );
    if ( error )
      return error;

    if ( FT_READ_USHORT( n_of_entries ) )
      return error;
    if ( n_of_entries == 0 )
      return FT_THROW( Unknown_File_Format );

    for ( i = 0; i < n_of_entries; i++ )
    {
      if ( FT_READ_LONG( entry_id ) )
        return error;
      if ( entry_id == resource_fork_entry_id )
      {
        if ( FT_READ_LONG( entry_offset ) ||
             FT_READ_LONG( entry_length ) )
          continue;
        *result_offset = entry_offset;

        return FT_Err_Ok;
      }
      else
      {
        error = FT_Stream_Skip( stream, 4 + 4 );    /* offset + length */
        if ( error )
          return error;
      }
    }

    return FT_THROW( Unknown_File_Format );
  }